

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[18],char_const*,char[17],unsigned_long,char[50],std::atomic<unsigned_long>,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [18],char **RestArgs,char (*RestArgs_1) [17],
               unsigned_long *RestArgs_2,char (*RestArgs_3) [50],atomic<unsigned_long> *RestArgs_4,
               char (*RestArgs_5) [2])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  FormatStrSS<std::__cxx11::stringstream,char_const*>(ss,RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[17],unsigned_long,char[50],std::atomic<unsigned_long>,char[2]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}